

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O1

void Abc_SclUnmarkCriticalNodeWindow(SC_Man *p,Vec_Int_t *vPath)

{
  byte *pbVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  long lVar5;
  
  if (0 < vPath->nSize) {
    lVar5 = 0;
    do {
      iVar2 = vPath->pArray[lVar5];
      if (((long)iVar2 < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = pVVar3->pArray[iVar2];
      if (pvVar4 != (void *)0x0) {
        pbVar1 = (byte *)((long)pvVar4 + 0x14);
        *pbVar1 = *pbVar1 & 0xef;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vPath->nSize);
  }
  return;
}

Assistant:

void Abc_SclUnmarkCriticalNodeWindow( SC_Man * p, Vec_Int_t * vPath )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObjVec( vPath, p->pNtk, pObj, i )
        pObj->fMarkA = 0;
}